

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetUnknownFields
          (GeneratedMessageReflection *this,Message *message)

{
  Syntax SVar1;
  FileDescriptor *this_00;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_01;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  GeneratedMessageReflection *local_20;
  
  this_00 = Descriptor::file(this->descriptor_);
  SVar1 = FileDescriptor::syntax(this_00);
  if (SVar1 == SYNTAX_PROTO3) {
    this_local = (GeneratedMessageReflection *)anon_unknown_0::GetEmptyUnknownFieldSet();
  }
  else {
    this_01 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               *)GetInternalMetadataWithArena(this,message);
    if (((uint)*(undefined8 *)this_01 & 1) == 1) {
      local_20 = (GeneratedMessageReflection *)
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           (this_01);
    }
    else {
      local_20 = (GeneratedMessageReflection *)InternalMetadataWithArena::default_instance();
    }
    this_local = local_20;
  }
  return (UnknownFieldSet *)this_local;
}

Assistant:

const UnknownFieldSet& GeneratedMessageReflection::GetUnknownFields(
    const Message& message) const {
  if (descriptor_->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    // We have to ensure that any mutations made to the return value of
    // MutableUnknownFields() are not reflected here.
    return GetEmptyUnknownFieldSet();
  } else {
    return GetInternalMetadataWithArena(message).unknown_fields();
  }
}